

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtree.hpp
# Opt level: O0

node_type * __thiscall
perior::
rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
::split_leaf(node_type *__return_storage_ptr__,
            rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
            *this,size_t N,size_t vidx,indexable_type *entry)

{
  bool bVar1;
  reference prVar2;
  reference __x;
  reference puVar3;
  const_reference puVar4;
  reference ppVar5;
  const_reference puVar6;
  unsigned_long *puVar7;
  size_type sVar8;
  size_type sVar9;
  pointer ppVar10;
  cubic_periodic_boundary<perior::point<double,_2UL>_> *b;
  array<unsigned_long,_2UL> aVar11;
  pair<unsigned_long,_bool> pVar12;
  undefined1 local_378 [16];
  container local_368 [8];
  vec_iterator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>_*,_true>
  local_360;
  type local_358;
  type local_338;
  undefined8 local_318;
  undefined1 local_310;
  undefined1 local_308 [24];
  pair<unsigned_long,_bool> next;
  undefined1 local_2c8 [16];
  const_iterator e_2;
  vec_iterator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>_*,_true>
  local_2b0;
  const_iterator i_2;
  type local_2a0;
  undefined1 local_280 [16];
  const_iterator e_1;
  vec_iterator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>_*,_true>
  local_268;
  const_iterator i_1;
  undefined1 local_258 [16];
  vec_iterator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>_*,_true>
  local_248;
  undefined1 local_240 [8];
  undefined1 local_238 [16];
  vec_iterator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>_*,_true>
  local_228;
  undefined1 local_220 [16];
  undefined1 local_210 [8];
  array<unsigned_long,_2UL> seeds;
  undefined1 local_1d8 [16];
  const_iterator e;
  vec_iterator<unsigned_long_*,_true> local_1c0;
  const_iterator i;
  pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_> local_1a8;
  undefined1 local_180 [8];
  temporal_entry_container entries;
  node_type *node;
  indexable_type *entry_local;
  size_t vidx_local;
  size_t N_local;
  rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
  *this_local;
  node_type *partner;
  undefined1 *local_20;
  rectangle<perior::point<double,_2UL>_> *local_18;
  rectangle<perior::point<double,_2UL>_> *local_10;
  
  b = (cubic_periodic_boundary<perior::point<double,_2UL>_> *)entry;
  entry_local = (indexable_type *)vidx;
  vidx_local = N;
  N_local = (size_t)this;
  this_local = (rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
                *)__return_storage_ptr__;
  prVar2 = boost::container::
           vector<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>,_std::allocator<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>_>,_void>
           ::at(&this->tree_,N);
  entries.
  super_vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
  .m_holder.m_size._7_1_ = 0;
  detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>::rtree_node
            (__return_storage_ptr__,true,prVar2->parent);
  boost::container::
  static_vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_void>
  ::static_vector((static_vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_void>
                   *)local_180);
  std::make_pair<unsigned_long_const&,perior::rectangle<perior::point<double,2ul>>const&>
            (&local_1a8,(unsigned_long *)&entry_local,entry);
  boost::container::
  vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
  ::push_back((vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
               *)local_180,&local_1a8);
  boost::container::
  vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
  ::begin((vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
           *)&e);
  boost::container::vec_iterator<unsigned_long_*,_true>::vec_iterator
            (&local_1c0,(nonconst_iterator *)&e);
  boost::container::
  vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
  ::end((vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
         *)local_1d8);
  boost::container::vec_iterator<unsigned_long_*,_true>::vec_iterator
            ((vec_iterator<unsigned_long_*,_true> *)(local_1d8 + 8),(nonconst_iterator *)local_1d8);
  while (bVar1 = boost::container::operator!=
                           (&local_1c0,(vec_iterator<unsigned_long_*,_true> *)(local_1d8 + 8)),
        bVar1) {
    __x = boost::container::vec_iterator<unsigned_long_*,_true>::operator*(&local_1c0);
    puVar3 = boost::container::vec_iterator<unsigned_long_*,_true>::operator*(&local_1c0);
    partner = (node_type *)
              boost::container::
              vector<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_void>
              ::at(&this->container_,*puVar3);
    local_20 = &this->field_0x130;
    std::make_pair<unsigned_long_const&,perior::rectangle<perior::point<double,2ul>>const&>
              ((pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_> *)
               (seeds.elems + 1),__x,(rectangle<perior::point<double,_2UL>_> *)partner);
    boost::container::
    vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
    ::push_back((vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
                 *)local_180,
                (pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_> *)
                (seeds.elems + 1));
    boost::container::vec_iterator<unsigned_long_*,_true>::operator++(&local_1c0);
  }
  boost::container::
  vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
  ::clear(&(prVar2->entry).
           super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
         );
  boost::container::
  vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
  ::clear(&(__return_storage_ptr__->entry).
           super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
         );
  boost::container::
  vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
  ::begin((vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
           *)(local_220 + 8));
  boost::container::
  vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
  ::end((vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
         *)local_220);
  aVar11 = rtree<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>,perior::quadratic<6ul,2ul>,perior::cubic_periodic_boundary<perior::point<double,2ul>>,perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>,std::equal_to<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>,std::allocator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>>
           ::
           pick_seeds<boost::container::vec_iterator<std::pair<unsigned_long,perior::rectangle<perior::point<double,2ul>>>*,false>>
                     ((rtree<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>,perior::quadratic<6ul,2ul>,perior::cubic_periodic_boundary<perior::point<double,2ul>>,perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>,std::equal_to<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>,std::allocator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>>
                       *)this,(vec_iterator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>_*,_false>
                               *)(local_220 + 8),
                      (vec_iterator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>_*,_false>
                       *)local_220);
  seeds.elems[0] = aVar11.elems[1];
  local_210 = aVar11.elems[0];
  puVar4 = boost::array<unsigned_long,_2UL>::operator[]((array<unsigned_long,_2UL> *)local_210,0);
  ppVar5 = boost::container::
           vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
           ::at((vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
                 *)local_180,*puVar4);
  boost::container::
  vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
  ::push_back(&(prVar2->entry).
               super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
              ,&ppVar5->first);
  puVar4 = boost::array<unsigned_long,_2UL>::operator[]((array<unsigned_long,_2UL> *)local_210,1);
  ppVar5 = boost::container::
           vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
           ::at((vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
                 *)local_180,*puVar4);
  boost::container::
  vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
  ::push_back(&(__return_storage_ptr__->entry).
               super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
              ,&ppVar5->first);
  puVar4 = boost::array<unsigned_long,_2UL>::operator[]((array<unsigned_long,_2UL> *)local_210,0);
  ppVar5 = boost::container::
           vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
           ::at((vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
                 *)local_180,*puVar4);
  local_10 = &ppVar5->second;
  rectangle<perior::point<double,_2UL>_>::operator=(&prVar2->box,local_10);
  puVar4 = boost::array<unsigned_long,_2UL>::operator[]((array<unsigned_long,_2UL> *)local_210,1);
  ppVar5 = boost::container::
           vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
           ::at((vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
                 *)local_180,*puVar4);
  local_18 = &ppVar5->second;
  rectangle<perior::point<double,_2UL>_>::operator=(&__return_storage_ptr__->box,local_18);
  boost::container::
  vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
  ::begin((vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
           *)local_238);
  puVar4 = boost::array<unsigned_long,_2UL>::operator[]((array<unsigned_long,_2UL> *)local_210,0);
  puVar6 = boost::array<unsigned_long,_2UL>::operator[]((array<unsigned_long,_2UL> *)local_210,1);
  puVar7 = std::max<unsigned_long>(puVar4,puVar6);
  boost::container::operator+
            ((container *)(local_238 + 8),
             (vec_iterator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>_*,_false>
              *)local_238,*puVar7);
  boost::container::
  vec_iterator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>_*,_true>::
  vec_iterator(&local_228,(nonconst_iterator *)(local_238 + 8));
  boost::container::
  vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
  ::erase((vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
           *)local_240,(const_iterator *)local_180);
  boost::container::
  vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
  ::begin((vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
           *)local_258);
  puVar4 = boost::array<unsigned_long,_2UL>::operator[]((array<unsigned_long,_2UL> *)local_210,0);
  puVar6 = boost::array<unsigned_long,_2UL>::operator[]((array<unsigned_long,_2UL> *)local_210,1);
  puVar7 = std::min<unsigned_long>(puVar4,puVar6);
  boost::container::operator+
            ((container *)(local_258 + 8),
             (vec_iterator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>_*,_false>
              *)local_258,*puVar7);
  boost::container::
  vec_iterator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>_*,_true>::
  vec_iterator(&local_248,(nonconst_iterator *)(local_258 + 8));
  boost::container::
  vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
  ::erase((vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
           *)&i_1,(const_iterator *)local_180);
  do {
    bVar1 = boost::container::
            vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
            ::empty((vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
                     *)local_180);
    if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_00129ef3;
    sVar8 = boost::container::
            vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
            ::size(&(prVar2->entry).
                    super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
                  );
    if (sVar8 < 2) {
      sVar8 = boost::container::
              vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
              ::size(&(prVar2->entry).
                      super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
                    );
      sVar9 = boost::container::
              vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
              ::size((vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
                      *)local_180);
      if (sVar9 <= 2 - sVar8) {
        boost::container::
        vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
        ::begin((vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
                 *)&e_1);
        boost::container::
        vec_iterator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>_*,_true>
        ::vec_iterator(&local_268,(nonconst_iterator *)&e_1);
        boost::container::
        vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
        ::end((vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
               *)local_280);
        boost::container::
        vec_iterator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>_*,_true>
        ::vec_iterator((vec_iterator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>_*,_true>
                        *)(local_280 + 8),(nonconst_iterator *)local_280);
        while (bVar1 = boost::container::operator!=
                                 (&local_268,
                                  (vec_iterator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>_*,_true>
                                   *)(local_280 + 8)), bVar1) {
          ppVar10 = boost::container::
                    vec_iterator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>_*,_true>
                    ::operator->(&local_268);
          boost::container::
          vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
          ::push_back(&(prVar2->entry).
                       super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
                      ,&ppVar10->first);
          ppVar10 = boost::container::
                    vec_iterator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>_*,_true>
                    ::operator->(&local_268);
          expand<perior::point<double,2ul>>
                    (&local_2a0,(perior *)&prVar2->box,&ppVar10->second,
                     (rectangle<perior::point<double,_2UL>_> *)&this->boundary_,b);
          rectangle<perior::point<double,_2UL>_>::operator=(&prVar2->box,&local_2a0);
          boost::container::
          vec_iterator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>_*,_true>
          ::operator++(&local_268);
        }
        goto LAB_00129ef3;
      }
    }
    sVar8 = boost::container::
            vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
            ::size(&(__return_storage_ptr__->entry).
                    super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
                  );
    if (sVar8 < 2) {
      sVar8 = boost::container::
              vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
              ::size(&(__return_storage_ptr__->entry).
                      super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
                    );
      sVar9 = boost::container::
              vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
              ::size((vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
                      *)local_180);
      if (sVar9 <= 2 - sVar8) {
        boost::container::
        vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
        ::begin((vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
                 *)&e_2);
        boost::container::
        vec_iterator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>_*,_true>
        ::vec_iterator(&local_2b0,(nonconst_iterator *)&e_2);
        boost::container::
        vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
        ::end((vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
               *)local_2c8);
        boost::container::
        vec_iterator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>_*,_true>
        ::vec_iterator((vec_iterator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>_*,_true>
                        *)(local_2c8 + 8),(nonconst_iterator *)local_2c8);
        while (bVar1 = boost::container::operator!=
                                 (&local_2b0,
                                  (vec_iterator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>_*,_true>
                                   *)(local_2c8 + 8)), bVar1) {
          ppVar10 = boost::container::
                    vec_iterator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>_*,_true>
                    ::operator->(&local_2b0);
          boost::container::
          vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
          ::push_back(&(__return_storage_ptr__->entry).
                       super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
                      ,&ppVar10->first);
          ppVar10 = boost::container::
                    vec_iterator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>_*,_true>
                    ::operator->(&local_2b0);
          expand<perior::point<double,2ul>>
                    ((type *)&next.second,(perior *)&__return_storage_ptr__->box,&ppVar10->second,
                     (rectangle<perior::point<double,_2UL>_> *)&this->boundary_,b);
          rectangle<perior::point<double,_2UL>_>::operator=
                    (&__return_storage_ptr__->box,
                     (rectangle<perior::point<double,_2UL>_> *)&next.second);
          boost::container::
          vec_iterator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>_*,_true>
          ::operator++(&local_2b0);
        }
LAB_00129ef3:
        entries.
        super_vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
        .m_holder.m_size._7_1_ = 1;
        i_2.m_ptr._4_4_ = 1;
        boost::container::
        static_vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_void>
        ::~static_vector((static_vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_void>
                          *)local_180);
        if ((entries.
             super_vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
             .m_holder.m_size._7_1_ & 1) == 0) {
          detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>::~rtree_node
                    (__return_storage_ptr__);
        }
        return __return_storage_ptr__;
      }
    }
    boost::container::
    vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
    ::begin((vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
             *)(local_308 + 8));
    boost::container::
    vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
    ::end((vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
           *)local_308);
    b = (cubic_periodic_boundary<perior::point<double,_2UL>_> *)&__return_storage_ptr__->box;
    pVar12 = rtree<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>,perior::quadratic<6ul,2ul>,perior::cubic_periodic_boundary<perior::point<double,2ul>>,perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>,std::equal_to<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>,std::allocator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>>
             ::
             pick_next<boost::container::vec_iterator<std::pair<unsigned_long,perior::rectangle<perior::point<double,2ul>>>*,false>>
                       ((rtree<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>,perior::quadratic<6ul,2ul>,perior::cubic_periodic_boundary<perior::point<double,2ul>>,perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>,std::equal_to<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>,std::allocator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>>
                         *)this,(vec_iterator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>_*,_false>
                                 *)(local_308 + 8),
                        (vec_iterator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>_*,_false>
                         *)local_308,&prVar2->box,(aabb_type *)b);
    local_318 = pVar12.first;
    local_310 = pVar12.second;
    local_308._16_8_ = local_318;
    next.first._0_1_ = local_310;
    if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      ppVar5 = boost::container::
               vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
               ::at((vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
                     *)local_180,local_318);
      boost::container::
      vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
      ::push_back(&(__return_storage_ptr__->entry).
                   super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
                  ,&ppVar5->first);
      ppVar5 = boost::container::
               vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
               ::at((vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
                     *)local_180,local_308._16_8_);
      expand<perior::point<double,2ul>>
                (&local_358,(perior *)&__return_storage_ptr__->box,&ppVar5->second,
                 (rectangle<perior::point<double,_2UL>_> *)&this->boundary_,b);
      rectangle<perior::point<double,_2UL>_>::operator=(&__return_storage_ptr__->box,&local_358);
    }
    else {
      ppVar5 = boost::container::
               vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
               ::at((vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
                     *)local_180,local_318);
      boost::container::
      vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
      ::push_back(&(prVar2->entry).
                   super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
                  ,&ppVar5->first);
      ppVar5 = boost::container::
               vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
               ::at((vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
                     *)local_180,local_308._16_8_);
      expand<perior::point<double,2ul>>
                (&local_338,(perior *)&prVar2->box,&ppVar5->second,
                 (rectangle<perior::point<double,_2UL>_> *)&this->boundary_,b);
      rectangle<perior::point<double,_2UL>_>::operator=(&prVar2->box,&local_338);
    }
    boost::container::
    vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
    ::begin((vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
             *)(local_378 + 8));
    boost::container::operator+
              (local_368,
               (vec_iterator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>_*,_false>
                *)(local_378 + 8),local_308._16_8_);
    boost::container::
    vec_iterator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>_*,_true>
    ::vec_iterator(&local_360,(nonconst_iterator *)local_368);
    boost::container::
    vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
    ::erase((vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
             *)local_378,(const_iterator *)local_180);
  } while( true );
}

Assistant:

node_type split_leaf(const std::size_t N,
                         const std::size_t vidx, const indexable_type& entry)
    {
        node_type& node = tree_.at(N);
        node_type  partner(true, node.parent);

        typedef typename gen_static_vector<std::pair<std::size_t, indexable_type>,
                max_entry+1>::type temporal_entry_container;
        temporal_entry_container entries;
        entries.push_back(std::make_pair(vidx, entry));

        for(typename node_type::const_iterator
                i(node.entry.begin()), e(node.entry.end()); i != e; ++i)
        {
            entries.push_back(std::make_pair(
                        *i, indexable_getter_(container_.at(*i))));
        }
        node.entry.clear();
        partner.entry.clear(); // for make it sure

        /* assign first 2 entries to node and partner */
        {
            const boost::array<std::size_t, 2> seeds =
                this->pick_seeds(entries.begin(), entries.end());
               node.entry.push_back(entries.at(seeds[0]).first);
            partner.entry.push_back(entries.at(seeds[1]).first);

               node.box = make_aabb(entries.at(seeds[0]).second);
            partner.box = make_aabb(entries.at(seeds[1]).second);

            // remove them from entries pool
            entries.erase(entries.begin() + std::max(seeds[0], seeds[1]));
            entries.erase(entries.begin() + std::min(seeds[0], seeds[1]));
        }

        while(!entries.empty())
        {
            if(min_entry > node.entry.size() &&
               min_entry - node.entry.size() >= entries.size())
            {
                for(typename temporal_entry_container::const_iterator
                        i(entries.begin()), e(entries.end()); i != e; ++i)
                {
                    node.entry.push_back(i->first);
                    node.box = expand(node.box, i->second, this->boundary_);
                }
                return partner;
            }
            if(min_entry > partner.entry.size() &&
               min_entry - partner.entry.size() >= entries.size())
            {
                for(typename temporal_entry_container::const_iterator
                        i(entries.begin()), e(entries.end()); i != e; ++i)
                {
                    partner.entry.push_back(i->first);
                    partner.box = expand(partner.box, i->second, this->boundary_);
                }
                return partner;
            }

            const std::pair<std::size_t, bool> next =
                this->pick_next(entries.begin(), entries.end(), node.box, partner.box);
            if(next.second) // next is for node
            {
                node.entry.push_back(entries.at(next.first).first);
                node.box =
                    expand(node.box, entries.at(next.first).second, this->boundary_);
            }
            else // next is for partner
            {
                partner.entry.push_back(entries.at(next.first).first);
                partner.box =
                    expand(partner.box, entries.at(next.first).second, this->boundary_);
            }
            entries.erase(entries.begin() + next.first);
        }
        return partner;
    }